

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.cpp
# Opt level: O1

NodeRecordMB * __thiscall
embree::sse2::BVHNBuilderMblurVirtual<4>::BVHNBuilderV::build
          (NodeRecordMB *__return_storage_ptr__,BVHNBuilderV *this,FastAllocator *allocator,
          BuildProgressMonitor *progressFunc,PrimRef *prims,PrimInfo *pinfo,Settings settings,
          BBox1f *timeRange)

{
  anon_class_8_1_8991fb9c createLeafFunc;
  Heuristic heuristic;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  long local_20;
  
  settings.branchingFactor = 4;
  settings.maxDepth = 0x28;
  local_20 = pinfo->end - pinfo->begin;
  local_68 = *(undefined8 *)
              &(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0;
  uStack_60 = *(undefined8 *)
               ((long)&(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
                       field_0 + 8);
  local_58 = *(undefined8 *)
              &(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0;
  uStack_50 = *(undefined8 *)
               ((long)&(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
                       field_0 + 8);
  local_48 = *(undefined8 *)
              &(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0;
  uStack_40 = *(undefined8 *)
               ((long)&(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
                       field_0 + 8);
  local_38 = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[0]
  ;
  fStack_34 = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128
              [1];
  fStack_30 = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128
              [2];
  fStack_2c = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128
              [3];
  local_28 = 0;
  createLeafFunc.this = this;
  heuristic.prims = prims;
  GeneralBVHBuilder::
  build<embree::BVHNodeRecordMB<embree::NodeRefPtr<4>>,embree::sse2::HeuristicArrayBinningSAH<embree::PrimRef,32ul>,embree::sse2::PrimInfoRange,embree::PrimRef,embree::FastAllocator::Create,embree::AABBNodeMB_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB_t<embree::NodeRefPtr<4>,4>::SetTimeRange,embree::sse2::BVHNBuilderMblurVirtual<4>::BVHNBuilderV::build(embree::FastAllocator*,embree::BuildProgressMonitor&,embree::PrimRef*,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>const&,embree::sse2::GeneralBVHBuilder::Settings,embree::BBox<float>const&)::_lambda(embree::PrimRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::BuildProgressMonitor>
            (*timeRange,(GeneralBVHBuilder *)__return_storage_ptr__,&heuristic,prims,&local_68,
             allocator,&createLeafFunc,progressFunc,&settings);
  return __return_storage_ptr__;
}

Assistant:

typename BVHN<N>::NodeRecordMB BVHNBuilderMblurVirtual<N>::BVHNBuilderV::build(FastAllocator* allocator, BuildProgressMonitor& progressFunc, PrimRef* prims, const PrimInfo& pinfo, GeneralBVHBuilder::Settings settings, const BBox1f& timeRange)
    {
      auto createLeafFunc = [&] (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) -> NodeRecordMB {
        return createLeaf(prims,set,alloc);
      };

      settings.branchingFactor = N;
      settings.maxDepth = BVH::maxBuildDepthLeaf;
      return BVHBuilderBinnedSAH::build<NodeRecordMB>
        (FastAllocator::Create(allocator),typename BVH::AABBNodeMB::Create(),typename BVH::AABBNodeMB::SetTimeRange(timeRange),createLeafFunc,progressFunc,prims,pinfo,settings);
    }